

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O0

bool __thiscall trun::TestRunner::ExecuteModuleTests(TestRunner *this)

{
  byte bVar1;
  TestModuleExecutorBase *pTVar2;
  bool res;
  TestModuleExecutorBase *executor;
  TestRunner *this_local;
  
  SetCurrentTestRunner(this);
  gnilk::Log::Info<char_const*>(this->pLogger,"Executing library tests");
  pTVar2 = TestModuleExecutorFactory::Create();
  bVar1 = (**(code **)(*(long *)pTVar2 + 0x10))(pTVar2,&this->library,&this->testModules);
  gnilk::Log::Info<char_const*>(this->pLogger,"Done: library tests\n\n");
  return (bool)(bVar1 & 1);
}

Assistant:

bool TestRunner::ExecuteModuleTests() {
    SetCurrentTestRunner(this);
    pLogger->Info("Executing library tests");
    auto &executor = TestModuleExecutorFactory::Create();
    auto res = executor.Execute(library, testModules);
    pLogger->Info("Done: library tests\n\n");
    return res;
}